

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  FlatCOptions local_10c8;
  FlatCOptions *local_c88;
  FlatCOptions *options;
  shared_ptr<flatbuffers::CodeGenerator> local_c78;
  undefined1 local_c67;
  undefined1 local_c66;
  undefined1 local_c65;
  allocator<char> local_c64;
  allocator<char> local_c63;
  allocator<char> local_c62;
  allocator<char> local_c61;
  FlatCOption local_c60;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_be0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_bd8;
  undefined1 local_bc7;
  undefined1 local_bc6;
  undefined1 local_bc5;
  allocator<char> local_bc4;
  allocator<char> local_bc3;
  allocator<char> local_bc2;
  allocator<char> local_bc1;
  FlatCOption local_bc0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_b40
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_b38;
  undefined1 local_b27;
  undefined1 local_b26;
  undefined1 local_b25;
  allocator<char> local_b24;
  allocator<char> local_b23;
  allocator<char> local_b22;
  allocator<char> local_b21;
  FlatCOption local_b20;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_aa0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_a98;
  undefined1 local_a87;
  undefined1 local_a86;
  undefined1 local_a85;
  allocator<char> local_a84;
  allocator<char> local_a83;
  allocator<char> local_a82;
  allocator<char> local_a81;
  FlatCOption local_a80;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_a00
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_9f8;
  undefined1 local_9e7;
  undefined1 local_9e6;
  undefined1 local_9e5;
  allocator<char> local_9e4;
  allocator<char> local_9e3;
  allocator<char> local_9e2;
  allocator<char> local_9e1;
  FlatCOption local_9e0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_960
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_958;
  undefined1 local_947;
  undefined1 local_946;
  undefined1 local_945;
  allocator<char> local_944;
  allocator<char> local_943;
  allocator<char> local_942;
  allocator<char> local_941;
  FlatCOption local_940;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_8c0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_8b8;
  undefined1 local_8a7;
  undefined1 local_8a6;
  undefined1 local_8a5;
  allocator<char> local_8a4;
  allocator<char> local_8a3;
  allocator<char> local_8a2;
  allocator<char> local_8a1;
  FlatCOption local_8a0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_820
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_818;
  undefined1 local_807;
  undefined1 local_806;
  undefined1 local_805;
  allocator<char> local_804;
  allocator<char> local_803;
  allocator<char> local_802;
  allocator<char> local_801;
  FlatCOption local_800;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_780
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_778;
  undefined1 local_767;
  undefined1 local_766;
  undefined1 local_765;
  allocator<char> local_764;
  allocator<char> local_763;
  allocator<char> local_762;
  allocator<char> local_761;
  FlatCOption local_760;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_6e0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_6d8;
  undefined1 local_6c7;
  undefined1 local_6c6;
  undefined1 local_6c5;
  allocator<char> local_6c4;
  allocator<char> local_6c3;
  allocator<char> local_6c2;
  allocator<char> local_6c1;
  FlatCOption local_6c0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_640
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_638;
  undefined1 local_627;
  undefined1 local_626;
  undefined1 local_625;
  allocator<char> local_624;
  allocator<char> local_623;
  allocator<char> local_622;
  allocator<char> local_621;
  FlatCOption local_620;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_5a0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_598;
  undefined1 local_587;
  undefined1 local_586;
  undefined1 local_585;
  allocator<char> local_584;
  allocator<char> local_583;
  allocator<char> local_582;
  allocator<char> local_581;
  FlatCOption local_580;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_500
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_4f8;
  undefined1 local_4e7;
  undefined1 local_4e6;
  undefined1 local_4e5;
  allocator<char> local_4e4;
  allocator<char> local_4e3;
  allocator<char> local_4e2;
  allocator<char> local_4e1;
  FlatCOption local_4e0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_460
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_458;
  undefined1 local_447;
  undefined1 local_446;
  undefined1 local_445;
  allocator<char> local_444;
  allocator<char> local_443;
  allocator<char> local_442;
  allocator<char> local_441;
  FlatCOption local_440;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_3c0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_3b8;
  undefined1 local_3a7;
  undefined1 local_3a6;
  undefined1 local_3a5;
  allocator<char> local_3a4;
  allocator<char> local_3a3;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  FlatCOption local_3a0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_320
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_318;
  undefined1 local_307;
  undefined1 local_306;
  undefined1 local_305;
  allocator<char> local_304;
  allocator<char> local_303;
  allocator<char> local_302;
  allocator<char> local_301;
  FlatCOption local_300;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_280
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_278;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  allocator<char> local_264;
  allocator<char> local_263;
  allocator<char> local_262;
  allocator<char> local_261;
  FlatCOption local_260;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_1e0
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_1d8;
  undefined1 local_1c7;
  undefined1 local_1c6;
  undefined1 local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  FlatCOption local_1c0;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> local_140
  ;
  shared_ptr<flatbuffers::CodeGenerator> local_138;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  FlatCOption local_120;
  undefined1 local_a0 [8];
  FlatCompiler flatc;
  InitParams params;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string flatbuffers_version;
  char **argv_local;
  int argc_local;
  
  flatbuffers_version.field_2._8_8_ = argv;
  __s = flatbuffers::FLATBUFFERS_VERSION();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  g_program_name = *(char **)flatbuffers_version.field_2._8_8_;
  flatbuffers::FlatCompiler::InitParams::InitParams((InitParams *)&flatc.params_.error_fn);
  flatc.params_.error_fn = Warn;
  flatbuffers::FlatCompiler::FlatCompiler
            ((FlatCompiler *)local_a0,(InitParams *)&flatc.params_.error_fn);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"b",&local_121);
  local_127 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120.long_opt,"binary",&local_122);
  local_126 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120.parameter,"",&local_123);
  local_125 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120.description,
             "Generate wire format binaries for any data definitions",&local_124);
  local_125 = 0;
  local_126 = 0;
  local_127 = 0;
  flatbuffers::NewBinaryCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_138,&local_140);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_120,&local_138);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_138);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_140);
  flatbuffers::FlatCOption::~FlatCOption(&local_120);
  std::allocator<char>::~allocator(&local_124);
  std::allocator<char>::~allocator(&local_123);
  std::allocator<char>::~allocator(&local_122);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"c",&local_1c1);
  local_1c7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0.long_opt,"cpp",&local_1c2)
  ;
  local_1c6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0.parameter,"",&local_1c3);
  local_1c5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0.description,"Generate C++ headers for tables/structs",&local_1c4);
  local_1c5 = 0;
  local_1c6 = 0;
  local_1c7 = 0;
  flatbuffers::NewCppCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_1d8,&local_1e0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_1c0,&local_1d8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_1d8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_1e0);
  flatbuffers::FlatCOption::~FlatCOption(&local_1c0);
  std::allocator<char>::~allocator(&local_1c4);
  std::allocator<char>::~allocator(&local_1c3);
  std::allocator<char>::~allocator(&local_1c2);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"n",&local_261);
  local_267 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260.long_opt,"csharp",&local_262);
  local_266 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260.parameter,"",&local_263);
  local_265 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260.description,"Generate C# classes for tables/structs",&local_264);
  local_265 = 0;
  local_266 = 0;
  local_267 = 0;
  flatbuffers::NewCSharpCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_278,&local_280);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_260,&local_278);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_278);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_280);
  flatbuffers::FlatCOption::~FlatCOption(&local_260);
  std::allocator<char>::~allocator(&local_264);
  std::allocator<char>::~allocator(&local_263);
  std::allocator<char>::~allocator(&local_262);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"d",&local_301);
  local_307 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300.long_opt,"dart",&local_302);
  local_306 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300.parameter,"",&local_303);
  local_305 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300.description,"Generate Dart classes for tables/structs",&local_304)
  ;
  local_305 = 0;
  local_306 = 0;
  local_307 = 0;
  flatbuffers::NewDartCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_318,&local_320);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_300,&local_318);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_318);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_320);
  flatbuffers::FlatCOption::~FlatCOption(&local_300);
  std::allocator<char>::~allocator(&local_304);
  std::allocator<char>::~allocator(&local_303);
  std::allocator<char>::~allocator(&local_302);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"",&local_3a1);
  local_3a7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0.long_opt,"proto",&local_3a2);
  local_3a6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0.parameter,"",&local_3a3);
  local_3a5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0.description,"Input is a .proto, translate to .fbs",&local_3a4);
  local_3a5 = 0;
  local_3a6 = 0;
  local_3a7 = 0;
  flatbuffers::NewFBSCodeGenerator((flatbuffers *)&local_3c0,false);
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_3b8,&local_3c0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_3a0,&local_3b8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_3b8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_3c0);
  flatbuffers::FlatCOption::~FlatCOption(&local_3a0);
  std::allocator<char>::~allocator(&local_3a4);
  std::allocator<char>::~allocator(&local_3a3);
  std::allocator<char>::~allocator(&local_3a2);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"g",&local_441);
  local_447 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440.long_opt,"go",&local_442);
  local_446 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440.parameter,"",&local_443);
  local_445 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440.description,"Generate Go files for tables/structs",&local_444);
  local_445 = 0;
  local_446 = 0;
  local_447 = 0;
  flatbuffers::NewGoCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_458,&local_460);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_440,&local_458);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_458);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_460);
  flatbuffers::FlatCOption::~FlatCOption(&local_440);
  std::allocator<char>::~allocator(&local_444);
  std::allocator<char>::~allocator(&local_443);
  std::allocator<char>::~allocator(&local_442);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"j",&local_4e1);
  local_4e7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0.long_opt,"java",&local_4e2);
  local_4e6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0.parameter,"",&local_4e3);
  local_4e5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0.description,"Generate Java classes for tables/structs",&local_4e4)
  ;
  local_4e5 = 0;
  local_4e6 = 0;
  local_4e7 = 0;
  flatbuffers::NewJavaCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_4f8,&local_500);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_4e0,&local_4f8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_4f8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_500);
  flatbuffers::FlatCOption::~FlatCOption(&local_4e0);
  std::allocator<char>::~allocator(&local_4e4);
  std::allocator<char>::~allocator(&local_4e3);
  std::allocator<char>::~allocator(&local_4e2);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"",&local_581);
  local_587 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580.long_opt,"jsonschema",&local_582);
  local_586 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580.parameter,"",&local_583);
  local_585 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580.description,"Generate Json schema",&local_584);
  local_585 = 0;
  local_586 = 0;
  local_587 = 0;
  flatbuffers::NewJsonSchemaCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_598,&local_5a0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_580,&local_598);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_598);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_5a0);
  flatbuffers::FlatCOption::~FlatCOption(&local_580);
  std::allocator<char>::~allocator(&local_584);
  std::allocator<char>::~allocator(&local_583);
  std::allocator<char>::~allocator(&local_582);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"",&local_621);
  local_627 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620.long_opt,"kotlin",&local_622);
  local_626 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620.parameter,"",&local_623);
  local_625 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620.description,"Generate Kotlin classes for tables/structs",
             &local_624);
  local_625 = 0;
  local_626 = 0;
  local_627 = 0;
  flatbuffers::NewKotlinCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_638,&local_640);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_620,&local_638);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_638);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_640);
  flatbuffers::FlatCOption::~FlatCOption(&local_620);
  std::allocator<char>::~allocator(&local_624);
  std::allocator<char>::~allocator(&local_623);
  std::allocator<char>::~allocator(&local_622);
  std::allocator<char>::~allocator(&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"",&local_6c1);
  local_6c7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0.long_opt,"kotlin-kmp",&local_6c2);
  local_6c6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0.parameter,"",&local_6c3);
  local_6c5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0.description,
             "Generate Kotlin multiplatform classes for tables/structs",&local_6c4);
  local_6c5 = 0;
  local_6c6 = 0;
  local_6c7 = 0;
  flatbuffers::NewKotlinKMPCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_6d8,&local_6e0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_6c0,&local_6d8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_6d8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_6e0);
  flatbuffers::FlatCOption::~FlatCOption(&local_6c0);
  std::allocator<char>::~allocator(&local_6c4);
  std::allocator<char>::~allocator(&local_6c3);
  std::allocator<char>::~allocator(&local_6c2);
  std::allocator<char>::~allocator(&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"",&local_761);
  local_767 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760.long_opt,"lobster",&local_762);
  local_766 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_760.parameter,"",&local_763);
  local_765 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760.description,"Generate Lobster files for tables/structs",&local_764
            );
  local_765 = 0;
  local_766 = 0;
  local_767 = 0;
  flatbuffers::NewLobsterCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_778,&local_780);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_760,&local_778);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_778);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_780);
  flatbuffers::FlatCOption::~FlatCOption(&local_760);
  std::allocator<char>::~allocator(&local_764);
  std::allocator<char>::~allocator(&local_763);
  std::allocator<char>::~allocator(&local_762);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"l",&local_801);
  local_807 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800.long_opt,"lua",&local_802)
  ;
  local_806 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800.parameter,"",&local_803);
  local_805 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800.description,"Generate Lua files for tables/structs",&local_804);
  local_805 = 0;
  local_806 = 0;
  local_807 = 0;
  flatbuffers::NewLuaBfbsGenerator((flatbuffers *)&local_820,(string *)local_38);
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_818,&local_820);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_800,&local_818);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_818);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_820);
  flatbuffers::FlatCOption::~FlatCOption(&local_800);
  std::allocator<char>::~allocator(&local_804);
  std::allocator<char>::~allocator(&local_803);
  std::allocator<char>::~allocator(&local_802);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"",&local_8a1);
  local_8a7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0.long_opt,"nim",&local_8a2)
  ;
  local_8a6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0.parameter,"",&local_8a3);
  local_8a5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0.description,"Generate Nim files for tables/structs",&local_8a4);
  local_8a5 = 0;
  local_8a6 = 0;
  local_8a7 = 0;
  flatbuffers::NewNimBfbsGenerator((flatbuffers *)&local_8c0,(string *)local_38);
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_8b8,&local_8c0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_8a0,&local_8b8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_8b8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_8c0);
  flatbuffers::FlatCOption::~FlatCOption(&local_8a0);
  std::allocator<char>::~allocator(&local_8a4);
  std::allocator<char>::~allocator(&local_8a3);
  std::allocator<char>::~allocator(&local_8a2);
  std::allocator<char>::~allocator(&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"p",&local_941);
  local_947 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940.long_opt,"python",&local_942);
  local_946 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940.parameter,"",&local_943);
  local_945 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940.description,"Generate Python files for tables/structs",&local_944)
  ;
  local_945 = 0;
  local_946 = 0;
  local_947 = 0;
  flatbuffers::NewPythonCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_958,&local_960);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_940,&local_958);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_958);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_960);
  flatbuffers::FlatCOption::~FlatCOption(&local_940);
  std::allocator<char>::~allocator(&local_944);
  std::allocator<char>::~allocator(&local_943);
  std::allocator<char>::~allocator(&local_942);
  std::allocator<char>::~allocator(&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"",&local_9e1);
  local_9e7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0.long_opt,"php",&local_9e2)
  ;
  local_9e6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0.parameter,"",&local_9e3);
  local_9e5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0.description,"Generate PHP files for tables/structs",&local_9e4);
  local_9e5 = 0;
  local_9e6 = 0;
  local_9e7 = 0;
  flatbuffers::NewPhpCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_9f8,&local_a00);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_9e0,&local_9f8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_9f8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_a00);
  flatbuffers::FlatCOption::~FlatCOption(&local_9e0);
  std::allocator<char>::~allocator(&local_9e4);
  std::allocator<char>::~allocator(&local_9e3);
  std::allocator<char>::~allocator(&local_9e2);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"r",&local_a81);
  local_a87 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80.long_opt,"rust",&local_a82);
  local_a86 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80.parameter,"",&local_a83);
  local_a85 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80.description,"Generate Rust files for tables/structs",&local_a84);
  local_a85 = 0;
  local_a86 = 0;
  local_a87 = 0;
  flatbuffers::NewRustCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_a98,&local_aa0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_a80,&local_a98);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_a98);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_aa0);
  flatbuffers::FlatCOption::~FlatCOption(&local_a80);
  std::allocator<char>::~allocator(&local_a84);
  std::allocator<char>::~allocator(&local_a83);
  std::allocator<char>::~allocator(&local_a82);
  std::allocator<char>::~allocator(&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b20,"t",&local_b21);
  local_b27 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20.long_opt,"json",&local_b22);
  local_b26 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b20.parameter,"",&local_b23);
  local_b25 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20.description,"Generate text output for any data definitions",
             &local_b24);
  local_b25 = 0;
  local_b26 = 0;
  local_b27 = 0;
  flatbuffers::NewTextCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_b38,&local_b40);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_b20,&local_b38);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_b38);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_b40);
  flatbuffers::FlatCOption::~FlatCOption(&local_b20);
  std::allocator<char>::~allocator(&local_b24);
  std::allocator<char>::~allocator(&local_b23);
  std::allocator<char>::~allocator(&local_b22);
  std::allocator<char>::~allocator(&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc0,"",&local_bc1);
  local_bc7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc0.long_opt,"swift",&local_bc2);
  local_bc6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc0.parameter,"",&local_bc3);
  local_bc5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc0.description,"Generate Swift files for tables/structs",&local_bc4);
  local_bc5 = 0;
  local_bc6 = 0;
  local_bc7 = 0;
  flatbuffers::NewSwiftCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_bd8,&local_be0);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_bc0,&local_bd8);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_bd8);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr(&local_be0);
  flatbuffers::FlatCOption::~FlatCOption(&local_bc0);
  std::allocator<char>::~allocator(&local_bc4);
  std::allocator<char>::~allocator(&local_bc3);
  std::allocator<char>::~allocator(&local_bc2);
  std::allocator<char>::~allocator(&local_bc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60,"T",&local_c61);
  local_c67 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60.long_opt,"ts",&local_c62);
  local_c66 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60.parameter,"",&local_c63);
  local_c65 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c60.description,"Generate TypeScript code for tables/structs",
             &local_c64);
  local_c65 = 0;
  local_c66 = 0;
  local_c67 = 0;
  flatbuffers::NewTsCodeGenerator();
  std::shared_ptr<flatbuffers::CodeGenerator>::
  shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            (&local_c78,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&options);
  flatbuffers::FlatCompiler::RegisterCodeGenerator((FlatCompiler *)local_a0,&local_c60,&local_c78);
  std::shared_ptr<flatbuffers::CodeGenerator>::~shared_ptr(&local_c78);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr((unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
               *)&options);
  flatbuffers::FlatCOption::~FlatCOption(&local_c60);
  std::allocator<char>::~allocator(&local_c64);
  std::allocator<char>::~allocator(&local_c63);
  std::allocator<char>::~allocator(&local_c62);
  std::allocator<char>::~allocator(&local_c61);
  flatbuffers::FlatCompiler::ParseFromCommandLineArguments
            (&local_10c8,(FlatCompiler *)local_a0,argc,(char **)flatbuffers_version.field_2._8_8_);
  local_c88 = &local_10c8;
  iVar1 = flatbuffers::FlatCompiler::Compile((FlatCompiler *)local_a0,local_c88);
  flatbuffers::FlatCOptions::~FlatCOptions(&local_10c8);
  flatbuffers::FlatCompiler::~FlatCompiler((FlatCompiler *)local_a0);
  std::__cxx11::string::~string((string *)local_38);
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[]) {
  const std::string flatbuffers_version(flatbuffers::FLATBUFFERS_VERSION());

  g_program_name = argv[0];

  flatbuffers::FlatCompiler::InitParams params;
  params.warn_fn = Warn;
  params.error_fn = Error;

  flatbuffers::FlatCompiler flatc(params);

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{
          "b", "binary", "",
          "Generate wire format binaries for any data definitions" },
      flatbuffers::NewBinaryCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "c", "cpp", "",
                                "Generate C++ headers for tables/structs" },
      flatbuffers::NewCppCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "n", "csharp", "",
                                "Generate C# classes for tables/structs" },
      flatbuffers::NewCSharpCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "d", "dart", "",
                                "Generate Dart classes for tables/structs" },
      flatbuffers::NewDartCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "proto", "",
                                "Input is a .proto, translate to .fbs" },
      flatbuffers::NewFBSCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "g", "go", "",
                                "Generate Go files for tables/structs" },
      flatbuffers::NewGoCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "j", "java", "",
                                "Generate Java classes for tables/structs" },
      flatbuffers::NewJavaCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "jsonschema", "", "Generate Json schema" },
      flatbuffers::NewJsonSchemaCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "kotlin", "",
                                "Generate Kotlin classes for tables/structs" },
      flatbuffers::NewKotlinCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "kotlin-kmp", "",
                                "Generate Kotlin multiplatform classes for tables/structs" },
      flatbuffers::NewKotlinKMPCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "lobster", "",
                                "Generate Lobster files for tables/structs" },
      flatbuffers::NewLobsterCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "l", "lua", "",
                                "Generate Lua files for tables/structs" },
      flatbuffers::NewLuaBfbsGenerator(flatbuffers_version));

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "nim", "",
                                "Generate Nim files for tables/structs" },
      flatbuffers::NewNimBfbsGenerator(flatbuffers_version));

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "p", "python", "",
                                "Generate Python files for tables/structs" },
      flatbuffers::NewPythonCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "php", "",
                                "Generate PHP files for tables/structs" },
      flatbuffers::NewPhpCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "r", "rust", "",
                                "Generate Rust files for tables/structs" },
      flatbuffers::NewRustCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{
          "t", "json", "", "Generate text output for any data definitions" },
      flatbuffers::NewTextCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "swift", "",
                                "Generate Swift files for tables/structs" },
      flatbuffers::NewSwiftCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "T", "ts", "",
                                "Generate TypeScript code for tables/structs" },
      flatbuffers::NewTsCodeGenerator());

  // Create the FlatC options by parsing the command line arguments.
  const flatbuffers::FlatCOptions &options =
      flatc.ParseFromCommandLineArguments(argc, argv);

  // Compile with the extracted FlatC options.
  return flatc.Compile(options);
}